

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.h
# Opt level: O1

GOESRProduct * __thiscall GOESRProduct::operator=(GOESRProduct *this,GOESRProduct *param_1)

{
  __syscall_slong_t _Var1;
  
  std::
  vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>::
  _M_move_assign();
  _Var1 = (param_1->frameStart_).tv_nsec;
  (this->frameStart_).tv_sec = (param_1->frameStart_).tv_sec;
  (this->frameStart_).tv_nsec = _Var1;
  std::__cxx11::string::operator=((string *)&this->product_,(string *)&param_1->product_);
  std::__cxx11::string::operator=
            ((string *)&(this->product_).nameLong,(string *)&(param_1->product_).nameLong);
  std::__cxx11::string::operator=((string *)&this->region_,(string *)&param_1->region_);
  std::__cxx11::string::operator=
            ((string *)&(this->region_).nameLong,(string *)&(param_1->region_).nameLong);
  std::__cxx11::string::operator=((string *)&this->channel_,(string *)&param_1->channel_);
  std::__cxx11::string::operator=
            ((string *)&(this->channel_).nameLong,(string *)&(param_1->channel_).nameLong);
  std::__cxx11::string::operator=((string *)&this->satellite_,(string *)&param_1->satellite_);
  this->satelliteID_ = param_1->satelliteID_;
  std::__cxx11::string::operator=((string *)&this->instrument_,(string *)&param_1->instrument_);
  std::__cxx11::string::operator=((string *)&this->imagingMode_,(string *)&param_1->imagingMode_);
  std::__cxx11::string::operator=((string *)&this->resolution_,(string *)&param_1->resolution_);
  this->segmented_ = param_1->segmented_;
  return this;
}

Assistant:

GOESRProduct() = default;